

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

String * __thiscall
String::token(String *__return_storage_ptr__,String *this,char *separators,usize *start)

{
  usize uVar1;
  char *pcVar2;
  char *pcVar3;
  long length;
  usize len;
  char *endStr;
  char *p;
  usize *start_local;
  char *separators_local;
  String *this_local;
  String *result;
  
  pcVar2 = operator_cast_to_char_(this);
  uVar1 = *start;
  pcVar3 = strpbrk(pcVar2 + uVar1,separators);
  if (pcVar3 == (char *)0x0) {
    substr(__return_storage_ptr__,this,*start,-1);
    *start = this->data->len;
  }
  else {
    length = (long)pcVar3 - (long)(pcVar2 + uVar1);
    substr(__return_storage_ptr__,this,*start,length);
    *start = length + 1 + *start;
  }
  return __return_storage_ptr__;
}

Assistant:

String String::token(const char* separators, usize& start) const
{
  const char* p = *this + start;
  const char* endStr = strpbrk(p, separators);
  if(endStr)
  {
    usize len = endStr - p;
    String result = substr(start, len);
    start += len + 1;
    return result;
  }
  String result = substr(start);
  start = data->len;
  return result;
}